

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O0

void __thiscall
deqp::gls::StateChangePerformanceCase::requireCoordBuffers
          (StateChangePerformanceCase *this,int count)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  size_type sVar4;
  reference pvVar5;
  value_type_conflict4 local_48 [2];
  GLuint buffer;
  undefined1 local_38 [8];
  vector<float,_std::allocator<float>_> coords;
  Functions *gl;
  int count_local;
  StateChangePerformanceCase *this_local;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar2);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_coordBuffers);
  if ((int)sVar4 < count) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&this->m_coordBuffers,(long)count);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_38);
    anon_unknown_1::genCoords
              ((vector<float,_std::allocator<float>_> *)local_38,this->m_triangleCount);
    while (sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             (&this->m_coordBuffers), (int)sVar4 < count) {
      (**(code **)(coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 0x1b2))(1,local_48);
      dVar3 = (**(code **)(coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 0x200))();
      glu::checkError(dVar3,"glGenBuffers()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x117);
      (**(code **)(coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 0x10))(0x8892,local_48[0]);
      dVar3 = (**(code **)(coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 0x200))();
      glu::checkError(dVar3,"glBindBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x11a);
      pcVar1 = *(code **)(coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x54);
      sVar4 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)local_38);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_38,0);
      (*pcVar1)(0x8892,sVar4 << 2,pvVar5,0x88e4);
      dVar3 = (**(code **)(coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 0x200))();
      glu::checkError(dVar3,"glBufferData()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x11c);
      (**(code **)(coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 0x10))(0x8892,0);
      dVar3 = (**(code **)(coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 0x200))();
      glu::checkError(dVar3,"glBindBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x11e);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_coordBuffers,local_48);
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_38);
  }
  return;
}

Assistant:

void StateChangePerformanceCase::requireCoordBuffers (int count)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if ((int)m_coordBuffers.size() >= count)
		return;

	m_coordBuffers.reserve(count);

	vector<GLfloat> coords;
	genCoords(coords, m_triangleCount);

	while ((int)m_coordBuffers.size() < count)
	{
		GLuint buffer;

		gl.genBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers()");

		gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");
		gl.bufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(GLfloat)), &(coords[0]), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData()");
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");

		m_coordBuffers.push_back(buffer);
	}
}